

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O2

bool __thiscall UniformData::check(UniformData *this)

{
  _Elt_pointer paVar1;
  undefined8 uVar2;
  bool bVar3;
  
  paVar1 = (this->queue).c.
           super__Deque_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  bVar3 = (this->queue).c.
          super__Deque_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur != paVar1;
  if (bVar3) {
    uVar2 = *(undefined8 *)(paVar1->_M_elems + 2);
    *(undefined8 *)(this->value)._M_elems = *(undefined8 *)paVar1->_M_elems;
    *(undefined8 *)((this->value)._M_elems + 2) = uVar2;
    std::deque<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::pop_front
              ((deque<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)this);
  }
  this->change = bVar3;
  return bVar3;
}

Assistant:

bool UniformData::check() {
    if (queue.empty())
        change = false;
    else {
        value = queue.front();
        queue.pop();
        change = true;
    }
    return change;
}